

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_class_visibility.c
# Opt level: O2

value class_visibility_value_pair(class_visibility_id visibility)

{
  value v;
  value *ppvVar1;
  value pvVar2;
  
  v = value_create_array((value *)0x0,2);
  if (v != (value)0x0) {
    ppvVar1 = value_to_array(v);
    pvVar2 = value_create_string("visibility",10);
    *ppvVar1 = pvVar2;
    if (pvVar2 != (value)0x0) {
      pvVar2 = class_visibility_value(visibility);
      ppvVar1[1] = pvVar2;
      if (pvVar2 != (value)0x0) {
        return v;
      }
    }
    value_type_destroy(v);
  }
  return (value)0x0;
}

Assistant:

value class_visibility_value_pair(enum class_visibility_id visibility)
{
	static const char visibility_str[] = "visibility";
	value v = value_create_array(NULL, 2);
	value *v_array;

	if (v == NULL)
	{
		return NULL;
	}

	v_array = value_to_array(v);
	v_array[0] = value_create_string(visibility_str, sizeof(visibility_str) - 1);

	if (v_array[0] == NULL)
	{
		value_type_destroy(v);
		return NULL;
	}

	v_array[1] = class_visibility_value(visibility);

	if (v_array[1] == NULL)
	{
		value_type_destroy(v);
		return NULL;
	}

	return v;
}